

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O3

Node * __thiscall SQASTReader::readNode(SQASTReader *this,TreeOp op)

{
  int iVar1;
  BinExpr *pBVar2;
  DestructuringDecl *pDVar3;
  Expr *pEVar4;
  Chunk *pCVar5;
  ArrayExpr *pAVar6;
  IncExpr *pIVar7;
  TableDecl *pTVar8;
  TryStatement *pTVar9;
  WhileStatement *pWVar10;
  ForeachStatement *pFVar11;
  Block *pBVar12;
  IfStatement *pIVar13;
  SwitchStatement *pSVar14;
  LiteralExpr *pLVar15;
  ReturnStatement *pRVar16;
  DirectiveStmt *pDVar17;
  DoWhileStatement *pDVar18;
  ForStatement *pFVar19;
  CommaExpr *pCVar20;
  ClassDecl *pCVar21;
  Id *pIVar22;
  CallExpr *pCVar23;
  DeclGroup *pDVar24;
  EnumDecl *pEVar25;
  FunctionDecl *pFVar26;
  GetFieldExpr *pGVar27;
  Node *pNVar28;
  TerExpr *pTVar29;
  ValueDecl *pVVar30;
  ConstDecl *pCVar31;
  undefined **ppuVar32;
  bool bVar33;
  
  pNVar28 = (Node *)0x0;
  switch(op) {
  case TO_BLOCK:
    pBVar12 = readBlock(this,false);
    return (Node *)pBVar12;
  case TO_IF:
    pIVar13 = readIfStatement(this);
    return (Node *)pIVar13;
  case TO_WHILE:
    pWVar10 = readWhileStatement(this);
    return (Node *)pWVar10;
  case TO_DOWHILE:
    pDVar18 = readDoWhileStatement(this);
    return (Node *)pDVar18;
  case TO_FOR:
    pFVar19 = readForStatement(this);
    return (Node *)pFVar19;
  case TO_FOREACH:
    pFVar11 = readForeachStatement(this);
    return (Node *)pFVar11;
  case TO_SWITCH:
    pSVar14 = readSwitchStatement(this);
    return (Node *)pSVar14;
  case TO_RETURN:
    pRVar16 = readReturnStatement(this);
    return (Node *)pRVar16;
  case TO_YIELD:
    pEVar4 = readNullableExpression(this);
    pCVar5 = Arena::findChunk(this->astArena,0x28);
    pNVar28 = (Node *)pCVar5->_ptr;
    pCVar5->_ptr = (uint8_t *)&pNVar28[1]._coordinates;
    pNVar28->_op = TO_YIELD;
    (pNVar28->_coordinates).lineStart = -1;
    (pNVar28->_coordinates).columnStart = -1;
    (pNVar28->_coordinates).lineEnd = -1;
    (pNVar28->_coordinates).columnEnd = -1;
    pNVar28[1].super_ArenaObj._vptr_ArenaObj = (_func_int **)pEVar4;
    ppuVar32 = &PTR__ArenaObj_001a29b0;
    break;
  case TO_THROW:
    pEVar4 = readNullableExpression(this);
    pCVar5 = Arena::findChunk(this->astArena,0x28);
    pNVar28 = (Node *)pCVar5->_ptr;
    pCVar5->_ptr = (uint8_t *)&pNVar28[1]._coordinates;
    pNVar28->_op = TO_THROW;
    (pNVar28->_coordinates).lineStart = -1;
    (pNVar28->_coordinates).columnStart = -1;
    (pNVar28->_coordinates).lineEnd = -1;
    (pNVar28->_coordinates).columnEnd = -1;
    pNVar28[1].super_ArenaObj._vptr_ArenaObj = (_func_int **)pEVar4;
    ppuVar32 = &PTR__ArenaObj_001a29e8;
    break;
  case TO_TRY:
    pTVar9 = readTryStatement(this);
    return (Node *)pTVar9;
  case TO_BREAK:
    pCVar5 = Arena::findChunk(this->astArena,0x28);
    pNVar28 = (Node *)pCVar5->_ptr;
    pCVar5->_ptr = (uint8_t *)&pNVar28[1]._coordinates;
    pNVar28->_op = TO_BREAK;
    (pNVar28->_coordinates).lineStart = -1;
    (pNVar28->_coordinates).columnStart = -1;
    (pNVar28->_coordinates).lineEnd = -1;
    (pNVar28->_coordinates).columnEnd = -1;
    ppuVar32 = &PTR__ArenaObj_001a2a58;
    goto LAB_0012b390;
  case TO_CONTINUE:
    pCVar5 = Arena::findChunk(this->astArena,0x28);
    pNVar28 = (Node *)pCVar5->_ptr;
    pCVar5->_ptr = (uint8_t *)&pNVar28[1]._coordinates;
    pNVar28->_op = TO_CONTINUE;
    (pNVar28->_coordinates).lineStart = -1;
    (pNVar28->_coordinates).columnStart = -1;
    (pNVar28->_coordinates).lineEnd = -1;
    (pNVar28->_coordinates).columnEnd = -1;
    ppuVar32 = &PTR__ArenaObj_001a2aa8;
LAB_0012b390:
    (pNVar28->super_ArenaObj)._vptr_ArenaObj = (_func_int **)ppuVar32;
    pNVar28[1].super_ArenaObj._vptr_ArenaObj = (_func_int **)0x0;
    return pNVar28;
  case TO_EXPR_STMT:
    pEVar4 = readExpression(this);
    pCVar5 = Arena::findChunk(this->astArena,0x28);
    pNVar28 = (Node *)pCVar5->_ptr;
    pCVar5->_ptr = (uint8_t *)&pNVar28[1]._coordinates;
    pNVar28->_op = TO_EXPR_STMT;
    (pNVar28->_coordinates).lineStart = -1;
    (pNVar28->_coordinates).columnStart = -1;
    (pNVar28->_coordinates).lineEnd = -1;
    (pNVar28->_coordinates).columnEnd = -1;
    ppuVar32 = &PTR__ArenaObj_001a2b18;
    goto LAB_0012b2f8;
  case TO_EMPTY:
    pCVar5 = Arena::findChunk(this->astArena,0x20);
    pNVar28 = (Node *)pCVar5->_ptr;
    pCVar5->_ptr = (uint8_t *)(pNVar28 + 1);
    pNVar28->_op = TO_EMPTY;
    (pNVar28->_coordinates).lineStart = -1;
    (pNVar28->_coordinates).columnStart = -1;
    (pNVar28->_coordinates).lineEnd = -1;
    (pNVar28->_coordinates).columnEnd = -1;
    ppuVar32 = &PTR__ArenaObj_001a2ae0;
    break;
  case TO_DIRECTIVE:
    pDVar17 = readDirectiveStmt(this);
    return (Node *)pDVar17;
  default:
    goto switchD_0012b1d2_caseD_10;
  case TO_ID:
    pIVar22 = readId(this);
    return (Node *)pIVar22;
  case TO_COMMA:
    pCVar20 = readCommaExpr(this);
    return (Node *)pCVar20;
  case TO_NULLC:
  case TO_ASSIGN:
  case TO_OROR:
  case TO_ANDAND:
  case TO_OR:
  case TO_XOR:
  case TO_AND:
  case TO_NE:
  case TO_EQ:
  case TO_3CMP:
  case TO_GE:
  case TO_GT:
  case TO_LE:
  case TO_LT:
  case TO_IN:
  case TO_INSTANCEOF:
  case TO_USHR:
  case TO_SHR:
  case TO_SHL:
  case TO_MUL:
  case TO_DIV:
  case TO_MOD:
  case TO_ADD:
  case TO_SUB:
  case TO_NEWSLOT:
  case TO_PLUSEQ:
  case TO_MINUSEQ:
  case TO_MULEQ:
  case TO_DIVEQ:
  case TO_MODEQ:
    pBVar2 = readBinExpr(this,op);
    return (Node *)pBVar2;
  case TO_NOT:
  case TO_BNOT:
  case TO_NEG:
  case TO_TYPEOF:
  case TO_RESUME:
  case TO_CLONE:
  case TO_PAREN:
  case TO_DELETE:
    pEVar4 = readExpression(this);
    pCVar5 = Arena::findChunk(this->astArena,0x28);
    pNVar28 = (Node *)pCVar5->_ptr;
    pCVar5->_ptr = (uint8_t *)&pNVar28[1]._coordinates;
    pNVar28->_op = op;
    (pNVar28->_coordinates).lineStart = -1;
    (pNVar28->_coordinates).columnStart = -1;
    (pNVar28->_coordinates).lineEnd = -1;
    (pNVar28->_coordinates).columnEnd = -1;
    (pNVar28->super_ArenaObj)._vptr_ArenaObj = (_func_int **)&PTR__ArenaObj_001a2bd8;
    pNVar28[1].super_ArenaObj._vptr_ArenaObj = (_func_int **)pEVar4;
    iVar1 = (pEVar4->super_Node)._coordinates.columnEnd;
    (pNVar28->_coordinates).lineEnd = (pEVar4->super_Node)._coordinates.lineEnd;
    (pNVar28->_coordinates).columnEnd = iVar1;
    return pNVar28;
  case TO_LITERAL:
    pLVar15 = readLiteral(this);
    return (Node *)pLVar15;
  case TO_BASE:
    pCVar5 = Arena::findChunk(this->astArena,0x20);
    pNVar28 = (Node *)pCVar5->_ptr;
    pCVar5->_ptr = (uint8_t *)(pNVar28 + 1);
    pNVar28->_op = TO_BASE;
    (pNVar28->_coordinates).lineStart = -1;
    (pNVar28->_coordinates).columnStart = -1;
    (pNVar28->_coordinates).lineEnd = -1;
    (pNVar28->_coordinates).columnEnd = -1;
    ppuVar32 = &PTR__ArenaObj_001a2c80;
    break;
  case TO_ROOT_TABLE_ACCESS:
    pCVar5 = Arena::findChunk(this->astArena,0x20);
    pNVar28 = (Node *)pCVar5->_ptr;
    pCVar5->_ptr = (uint8_t *)(pNVar28 + 1);
    pNVar28->_op = TO_ROOT_TABLE_ACCESS;
    (pNVar28->_coordinates).lineStart = -1;
    (pNVar28->_coordinates).columnStart = -1;
    (pNVar28->_coordinates).lineEnd = -1;
    (pNVar28->_coordinates).columnEnd = -1;
    ppuVar32 = &PTR__ArenaObj_001a2cb8;
    break;
  case TO_INC:
    pIVar7 = readIncExpr(this);
    return (Node *)pIVar7;
  case TO_DECL_EXPR:
    pEVar4 = (Expr *)readDeclaration(this);
    pCVar5 = Arena::findChunk(this->astArena,0x28);
    pNVar28 = (Node *)pCVar5->_ptr;
    pCVar5->_ptr = (uint8_t *)&pNVar28[1]._coordinates;
    pNVar28->_op = TO_DECL_EXPR;
    (pNVar28->_coordinates).lineStart = -1;
    (pNVar28->_coordinates).columnStart = -1;
    (pNVar28->_coordinates).lineEnd = -1;
    (pNVar28->_coordinates).columnEnd = -1;
    ppuVar32 = &PTR__ArenaObj_001a2d60;
LAB_0012b2f8:
    (pNVar28->super_ArenaObj)._vptr_ArenaObj = (_func_int **)ppuVar32;
    pNVar28[1].super_ArenaObj._vptr_ArenaObj = (_func_int **)pEVar4;
    return pNVar28;
  case TO_ARRAYEXPR:
    pAVar6 = readArrayExpr(this);
    return (Node *)pAVar6;
  case TO_GETFIELD:
    pGVar27 = readGetFieldExpr(this);
    return (Node *)pGVar27;
  case TO_GETSLOT:
    pNVar28 = (Node *)readGetSlotExpr(this);
    return pNVar28;
  case TO_CALL:
    pCVar23 = readCallExpr(this);
    return (Node *)pCVar23;
  case TO_TERNARY:
    pTVar29 = readTernaryExpr(this);
    return (Node *)pTVar29;
  case TO_VAR:
    bVar33 = true;
    goto LAB_0012b5b7;
  case TO_PARAM:
    bVar33 = false;
LAB_0012b5b7:
    pVVar30 = readValueDecl(this,bVar33);
    return (Node *)pVVar30;
  case TO_CONST:
    pCVar31 = readConstDecl(this);
    return (Node *)pCVar31;
  case TO_DECL_GROUP:
    pDVar24 = readDeclGroup(this);
    return (Node *)pDVar24;
  case TO_DESTRUCTURE:
    pDVar3 = readDestructuringDecl(this);
    return (Node *)pDVar3;
  case TO_FUNCTION:
    bVar33 = false;
    goto LAB_0012b515;
  case TO_CONSTRUCTOR:
    bVar33 = true;
LAB_0012b515:
    pFVar26 = readFunctionDecl(this,bVar33);
    return (Node *)pFVar26;
  case TO_CLASS:
    pCVar21 = readClassDecl(this);
    return (Node *)pCVar21;
  case TO_ENUM:
    pEVar25 = readEnumDecl(this);
    return (Node *)pEVar25;
  case TO_TABLE:
    pTVar8 = readTableDecl(this);
    return (Node *)pTVar8;
  }
  (pNVar28->super_ArenaObj)._vptr_ArenaObj = (_func_int **)ppuVar32;
switchD_0012b1d2_caseD_10:
  return pNVar28;
}

Assistant:

Node *SQASTReader::readNode(enum TreeOp op) {
  switch (op)
  {
  case TO_BLOCK: return readBlock(false);
  case TO_IF: return readIfStatement();
  case TO_WHILE: return readWhileStatement();
  case TO_DOWHILE: return readDoWhileStatement();
  case TO_FOR: return readForStatement();
  case TO_FOREACH: return readForeachStatement();
  case TO_SWITCH: return readSwitchStatement();
  case TO_RETURN: return readReturnStatement();
  case TO_YIELD: return readYieldStatement();
  case TO_THROW: return readThrowStatement();
  case TO_TRY: return readTryStatement();
  case TO_BREAK: return readBreakStatement();
  case TO_CONTINUE: return readContinueStatement();
  case TO_EXPR_STMT: return readExprStatement();
  case TO_EMPTY: return readEmptyStatement();
  // case TO_STATEMENT_MARK:
  case TO_ID: return readId();
  case TO_COMMA: return readCommaExpr();
  case TO_NULLC:
  case TO_ASSIGN:
  case TO_OROR:
  case TO_ANDAND:
  case TO_OR:
  case TO_XOR:
  case TO_AND:
  case TO_NE:
  case TO_EQ:
  case TO_3CMP:
  case TO_GE:
  case TO_GT:
  case TO_LE:
  case TO_LT:
  case TO_IN:
  case TO_INSTANCEOF:
  case TO_USHR:
  case TO_SHR:
  case TO_SHL:
  case TO_MUL:
  case TO_DIV:
  case TO_MOD:
  case TO_ADD:
  case TO_SUB:
  case TO_NEWSLOT:
  case TO_PLUSEQ:
  case TO_MINUSEQ:
  case TO_MULEQ:
  case TO_DIVEQ:
  case TO_MODEQ:
    return readBinExpr(op);
  case TO_NOT:
  case TO_BNOT:
  case TO_NEG:
  case TO_TYPEOF:
  case TO_RESUME:
  case TO_CLONE:
  case TO_PAREN:
  case TO_DELETE:
    return readUnaryExpr(op);
  case TO_LITERAL: return readLiteral();
  case TO_BASE: return readBaseExpr();
  case TO_ROOT_TABLE_ACCESS: return readRootTableAccessExpr();
  case TO_INC: return readIncExpr();
  case TO_DECL_EXPR: return readDeclExpr();
  case TO_ARRAYEXPR: return readArrayExpr();
  case TO_GETFIELD: return readGetFieldExpr();
  case TO_GETSLOT: return readGetSlotExpr();
  case TO_CALL: return readCallExpr();
  case TO_TERNARY: return readTernaryExpr();
  // case TO_EXPR_MARK:
  case TO_VAR: return readValueDecl(true);
  case TO_PARAM: return readValueDecl(false);
  case TO_CONST: return readConstDecl();
  case TO_DECL_GROUP: return readDeclGroup();
  case TO_DESTRUCTURE: return readDestructuringDecl();
  case TO_FUNCTION: return readFunctionDecl(false);
  case TO_CONSTRUCTOR: return readFunctionDecl(true);
  case TO_CLASS: return readClassDecl();
  case TO_ENUM: return readEnumDecl();
  case TO_TABLE: return readTableDecl();
  case TO_DIRECTIVE: return readDirectiveStmt();
  default:
    assert("Unknown Tree code");
    return NULL;
  }
}